

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall
NumberTemp::ProcessIndirUse
          (NumberTemp *this,IndirOpnd *indirOpnd,Instr *instr,BackwardPass *backwardPass)

{
  uint dstSymID_00;
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  undefined4 *puVar4;
  Opnd *this_00;
  RegOpnd *pRVar5;
  char16 *pcVar6;
  char16_t *pcVar7;
  char16_t *pcVar8;
  SymID dstSymID;
  Opnd *dstOpnd;
  bool isTempUse;
  BackwardPass *backwardPass_local;
  Instr *instr_local;
  IndirOpnd *indirOpnd_local;
  NumberTemp *this_local;
  
  bVar2 = BackwardPass::DoMarkTempNumbersOnTempObjects(backwardPass);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x356,"(backwardPass->DoMarkTempNumbersOnTempObjects())",
                       "backwardPass->DoMarkTempNumbersOnTempObjects()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IsTempIndirTransferLoad(this,instr,backwardPass);
  if (bVar2) {
    uVar3 = *(ushort *)&instr->field_0x36 >> 1;
    if ((uVar3 & 1) == 0) {
      this->nonTempElemLoad = true;
    }
    else {
      bVar2 = IsInLoop(this);
      if (bVar2) {
        this_00 = IR::Instr::GetDst(instr);
        bVar2 = IR::Opnd::IsRegOpnd(this_00);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                             ,0x365,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pRVar5 = IR::Opnd::AsRegOpnd(this_00);
        dstSymID_00 = (pRVar5->m_sym->super_Sym).m_id;
        TempTrackerBase::AddTransferDependencies
                  (&this->super_TempTrackerBase,&this->elemLoadDependencies,dstSymID_00);
        bVar2 = DoTrace(backwardPass);
        if (bVar2) {
          pcVar6 = GetTraceName();
          bVar2 = BackwardPass::IsPrePass(backwardPass);
          pcVar8 = L"";
          if (bVar2) {
            pcVar8 = L"Prepass ";
          }
          Output::Print(L"%s: %8s s%d -> []: ",pcVar6,pcVar8,(ulong)dstSymID_00);
          BVSparse<Memory::JitArenaAllocator>::Dump(&this->elemLoadDependencies);
        }
      }
    }
    bVar2 = DoTrace(backwardPass);
    if (bVar2) {
      pcVar6 = GetTraceName();
      bVar2 = BackwardPass::IsPrePass(backwardPass);
      pcVar8 = L"";
      if (bVar2) {
        pcVar8 = L"Prepass ";
      }
      pcVar7 = L"Non ";
      if ((uVar3 & 1) != 0) {
        pcVar7 = L"";
      }
      Output::Print(L"%s: %8s%4sTemp Use ([] )",pcVar6,pcVar8,pcVar7);
      IR::Instr::DumpSimple(instr);
    }
  }
  return;
}

Assistant:

void
NumberTemp::ProcessIndirUse(IR::IndirOpnd * indirOpnd, IR::Instr * instr, BackwardPass * backwardPass)
{
    Assert(backwardPass->DoMarkTempNumbersOnTempObjects());
    if (!NumberTemp::IsTempIndirTransferLoad(instr, backwardPass))
    {
        return;
    }

    bool isTempUse = instr->dstIsTempNumber;
    if (!isTempUse)
    {
        nonTempElemLoad = true;
    }
    else if (this->IsInLoop())
    {
        // We didn't already detect non temp use of this property id. so we should track the dependencies in loops
        IR::Opnd * dstOpnd = instr->GetDst();
        Assert(dstOpnd->IsRegOpnd());
        SymID dstSymID = dstOpnd->AsRegOpnd()->m_sym->m_id;

        // Use the no property id as a place holder for elem dependencies
        AddTransferDependencies(&elemLoadDependencies, dstSymID);
#if DBG_DUMP
        if (NumberTemp::DoTrace(backwardPass))
        {
            Output::Print(_u("%s: %8s s%d -> []: "), NumberTemp::GetTraceName(),
                backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), dstSymID);
            elemLoadDependencies.Dump();
        }
#endif
    }

#if DBG_DUMP
    if (NumberTemp::DoTrace(backwardPass))
    {
        Output::Print(_u("%s: %8s%4sTemp Use ([] )"), NumberTemp::GetTraceName(),
            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), isTempUse ? _u("") : _u("Non "));
        instr->DumpSimple();
    }
#endif
}